

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  uint16_t norm16_00;
  UChar *pUVar1;
  UBool UVar2;
  UChar *pUVar3;
  int local_5c;
  int local_4c;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UChar *prevSrc;
  ReorderingBuffer *buffer_local;
  UBool onlyContiguous_local;
  UBool stopAtCompBoundary_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  limit_local = src;
  if (UVar2 == '\0') {
    do {
      pUVar1 = limit_local;
      if (limit <= limit_local) {
        return limit_local;
      }
      if ((stopAtCompBoundary != '\0') && ((ushort)*limit_local < (ushort)this->minCompNoMaybeCP)) {
        return limit_local;
      }
      pUVar3 = limit_local + 1;
      __index = (int32_t)(ushort)*limit_local;
      if ((__index & 0xfffff800U) == 0xd800) {
        if ((((*limit_local & 0x400U) == 0) && (pUVar3 != limit)) && ((*pUVar3 & 0xfc00U) == 0xdc00)
           ) {
          __index = __index * 0x400 + (uint)(ushort)*pUVar3 + -0x35fdc00;
          if (__index < this->normTrie->highStart) {
            local_5c = ucptrie_internalSmallIndex_63(this->normTrie,__index);
          }
          else {
            local_5c = this->normTrie->dataLength + -2;
          }
          local_4c = local_5c;
          limit_local = limit_local + 2;
        }
        else {
          local_4c = this->normTrie->dataLength + -1;
          limit_local = pUVar3;
        }
      }
      else {
        local_4c = (uint)this->normTrie->index[__index >> 6] + (__index & 0x3fU);
        limit_local = pUVar3;
      }
      norm16_00 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_4c * 2);
      if ((stopAtCompBoundary != '\0') &&
         (UVar2 = norm16HasCompBoundaryBefore(this,norm16_00), UVar2 != '\0')) {
        return pUVar1;
      }
      UVar2 = decompose(this,__index,norm16_00,buffer,errorCode);
      if (UVar2 == '\0') {
        return (UChar *)0x0;
      }
    } while ((stopAtCompBoundary == '\0') ||
            (UVar2 = norm16HasCompBoundaryAfter(this,norm16_00,onlyContiguous), UVar2 == '\0'));
    this_local = (Normalizer2Impl *)limit_local;
  }
  else {
    this_local = (Normalizer2Impl *)0x0;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *
Normalizer2Impl::decomposeShort(const UChar *src, const UChar *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while(src<limit) {
        if (stopAtCompBoundary && *src < minCompNoMaybeCP) {
            return src;
        }
        const UChar *prevSrc = src;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
        if (stopAtCompBoundary && norm16HasCompBoundaryBefore(norm16)) {
            return prevSrc;
        }
        if(!decompose(c, norm16, buffer, errorCode)) {
            return nullptr;
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}